

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Roboteq.h
# Opt level: O2

int SetCommandRoboteq(ROBOTEQ *pRoboteq,int commandItem,int index,int value)

{
  int iVar1;
  ulong uVar2;
  char *__format;
  char command [10];
  char args [50];
  char response [256];
  
  uVar2 = (ulong)(uint)commandItem;
  if ((uint)commandItem < 0x100) {
    sprintf(command,"$%02X");
    sprintf(args,"%i %i",(ulong)(uint)index,(ulong)(uint)value);
    if (index == -0x400) {
      if (value != -0x400) {
        sprintf(args,"%i",(ulong)(uint)value);
      }
    }
    else if (index < 0) {
      __format = "Invalid parameter : index %d.\n";
      uVar2 = (ulong)(uint)index;
      goto LAB_0017a48d;
    }
    iVar1 = IssueCommandRoboteq(pRoboteq,"!",command,args,10,response,1);
    if (iVar1 == 0) {
      if (response[0] == '+') {
        return 0;
      }
      puts("Error reading data from a Roboteq : Command not recognized or lost. ");
    }
  }
  else {
    __format = "Invalid parameter : commandItem %d.\n";
LAB_0017a48d:
    printf(__format,uVar2);
  }
  return 1;
}

Assistant:

inline int SetCommandRoboteq(ROBOTEQ* pRoboteq, int commandItem, int index, int value)
{
	char command[10];
	char args[50];
	char response[256];

	if ((commandItem < 0)||(commandItem > 255))
	{
		printf("Invalid parameter : commandItem %d.\n", commandItem);
		return EXIT_FAILURE;
	}

	sprintf(command, "$%02X", commandItem);
	sprintf(args, "%i %i", index, value);
	if (index == MISSING_VALUE_ROBOTEQ)
	{
		if(value != MISSING_VALUE_ROBOTEQ)
			sprintf(args, "%i", value);
		index = 0;
	}

	if (index < 0)
	{
		printf("Invalid parameter : index %d.\n", index);
		return EXIT_FAILURE;
	}

	if (IssueCommandRoboteq(pRoboteq, "!", command, args, 10, response, TRUE) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	if (response[0] != '+')
	{
		printf("Error reading data from a Roboteq : Command not recognized or lost. \n");
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}